

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  value_type vVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar9;
  float *outptr;
  float score_2;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  vector<float,_std::allocator<float>_> *class_bbox_scores_1;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *class_bbox_rects_1;
  int i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  size_t z;
  size_t j_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  BBoxRect c;
  float *bbox_1;
  float score_1;
  int j;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> class_bbox_rects;
  int i_1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float pb_cy;
  float pb_cx;
  float pb_h;
  float pb_w;
  float *bbox;
  float *var;
  float *pb;
  float *loc;
  float score;
  int i;
  float *variance_ptr;
  float *priorbox_ptr;
  float *location_ptr;
  Mat bboxes;
  int num_class_copy;
  int num_prior;
  bool mxnet_ssd_style;
  Mat *priorbox;
  Mat *confidence;
  Mat *location;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb58;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  *in_stack_fffffffffffffb60;
  value_type *in_stack_fffffffffffffb68;
  void **ppvVar10;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb80;
  vector<float,_std::allocator<float>_> *this_00;
  iterator in_stack_fffffffffffffba8;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffffbb0;
  const_iterator in_stack_fffffffffffffbb8;
  float local_414;
  float *in_stack_fffffffffffffc00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc08;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffffc10;
  float local_3e4;
  void *local_3d0;
  int local_398;
  int local_394;
  int local_36c;
  int local_2f4;
  vector<float,_std::allocator<float>_> local_2f0;
  vector<float,_std::allocator<float>_> local_2d8;
  size_type local_2c0;
  ulong local_2b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b0;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  int local_284;
  undefined4 *local_280;
  float local_278;
  int local_274;
  vector<float,_std::allocator<float>_> local_270;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_258;
  int local_23c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_238;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_220;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float *local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float local_1c8;
  int local_1c4;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  undefined4 local_1a8;
  void *local_198;
  int *local_190;
  long local_188;
  undefined4 local_180;
  long *local_178;
  undefined4 local_170;
  int local_16c;
  undefined4 local_168;
  undefined4 local_164;
  int local_160;
  long local_158;
  int local_14c;
  int local_148;
  byte local_141;
  const_reference local_140;
  const_reference local_138;
  const_reference local_130;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_118;
  int local_104;
  void **local_100;
  reference local_f8;
  void **local_f0;
  const_reference local_e8;
  undefined4 local_dc;
  const_reference local_d8;
  undefined4 local_cc;
  const_reference local_c8;
  long local_c0;
  const_reference local_b8;
  long local_b0;
  const_reference local_a8;
  long local_a0;
  const_reference local_98;
  long local_90;
  const_reference local_88;
  int local_7c;
  reference local_78;
  int local_6c;
  void **local_68;
  int local_5c;
  void **local_58;
  void **local_50;
  void **local_40;
  reference local_38;
  int local_20;
  undefined4 local_1c;
  void **local_18;
  void *local_10;
  
  local_120 = in_RDX;
  local_118 = in_RSI;
  local_130 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_138 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_118,1);
  local_140 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_118,2);
  local_141 = *(int *)(in_RDI + 0xd0) == -0xe9;
  if ((bool)local_141) {
    local_394 = local_140->h;
  }
  else {
    local_394 = local_140->w / 4;
  }
  local_148 = local_394;
  if ((bool)local_141) {
    local_398 = local_138->h;
  }
  else {
    local_398 = *(int *)(in_RDI + 0xd0);
  }
  local_14c = local_398;
  local_100 = &local_198;
  local_198 = (void *)0x0;
  local_190 = (int *)0x0;
  local_188 = 0;
  local_180 = 0;
  local_178 = (long *)0x0;
  local_170 = 0;
  local_16c = 0;
  local_168 = 0;
  local_164 = 0;
  local_160 = 0;
  local_158 = 0;
  Mat::create(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78,
              (size_t)in_stack_fffffffffffffb70,(Allocator *)in_stack_fffffffffffffb68);
  local_f0 = &local_198;
  if (local_198 != (void *)0x0) {
    local_40 = local_f0;
  }
  if (local_198 != (void *)0x0 && local_158 * local_160 != 0) {
    local_e8 = local_130;
    local_1b0 = local_130->data;
    local_c8 = local_140;
    local_cc = 0;
    local_1b8 = local_140->data;
    if ((local_141 & 1) == 0) {
      local_d8 = local_140;
      local_dc = 1;
      local_3d0 = (void *)((long)local_140->data + (long)local_140->w * local_140->elemsize);
    }
    else {
      local_3d0 = (void *)0x0;
    }
    local_1c0 = local_3d0;
    for (local_1c4 = 0; local_1c4 < local_148; local_1c4 = local_1c4 + 1) {
      if ((local_141 & 1) == 0) {
        local_a0 = (long)local_1c4 * (long)local_14c;
        local_98 = local_138;
        in_stack_fffffffffffffc10 =
             (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
             ((long)local_138->data + local_a0 * 4);
        local_3e4 = *(float *)&(in_stack_fffffffffffffc10->
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                               _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        local_90 = (long)local_1c4;
        local_88 = local_138;
        local_3e4 = *(float *)((long)local_138->data + local_90 * 4);
      }
      local_1c8 = local_3e4;
      if (local_3e4 < 1.0 - *(float *)(in_RDI + 0xe0)) {
        local_1d0 = (float *)((long)local_1b0 + (long)(local_1c4 << 2) * 4);
        local_1d8 = (float *)((long)local_1b8 + (long)(local_1c4 << 2) * 4);
        if (local_1c0 == (void *)0x0) {
          in_stack_fffffffffffffc08 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xe4);
        }
        else {
          in_stack_fffffffffffffc08 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)local_1c0 + (long)(local_1c4 << 2) * 4);
        }
        local_58 = &local_198;
        local_5c = local_1c4;
        in_stack_fffffffffffffc00 =
             (float *)((long)local_198 + (long)local_16c * (long)local_1c4 * local_188);
        local_1ec = local_1d8[2] - *local_1d8;
        local_1f0 = local_1d8[3] - local_1d8[1];
        local_1f4 = (*local_1d8 + local_1d8[2]) * 0.5;
        local_1f8 = (local_1d8[1] + local_1d8[3]) * 0.5;
        local_1fc = *(float *)&(in_stack_fffffffffffffc08->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start * *local_1d0 * local_1ec +
                    local_1f4;
        local_200 = *(float *)((long)&(in_stack_fffffffffffffc08->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 4) * local_1d0[1]
                    * local_1f0 + local_1f8;
        local_1e8 = in_stack_fffffffffffffc00;
        local_1e0 = in_stack_fffffffffffffc08;
        local_204 = expf(*(float *)&(in_stack_fffffffffffffc08->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish * local_1d0[2]);
        local_204 = local_204 * local_1ec;
        local_208 = expf(*(float *)((long)&(local_1e0->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_finish + 4) *
                         local_1d0[3]);
        local_208 = local_208 * local_1f0;
        *local_1e8 = local_1fc - local_204 * 0.5;
        local_1e8[1] = local_200 - local_208 * 0.5;
        local_1e8[2] = local_1fc + local_204 * 0.5;
        local_1e8[3] = local_200 + local_208 * 0.5;
      }
    }
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x13db3b1);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x13db3be);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffb80,
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffb80,
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    for (local_23c = 1; local_23c < local_14c; local_23c = local_23c + 1) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x13db418);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x13db425);
      for (local_274 = 0; local_274 < local_148; local_274 = local_274 + 1) {
        if ((local_141 & 1) == 0) {
          local_c0 = (long)(local_274 * local_14c + local_23c);
          local_b8 = local_138;
          local_414 = *(float *)((long)local_138->data + local_c0 * 4);
        }
        else {
          local_b0 = (long)(local_23c * local_148 + local_274);
          local_a8 = local_138;
          local_414 = *(float *)((long)local_138->data + local_b0 * 4);
        }
        local_278 = local_414;
        if (*(float *)(in_RDI + 0xe0) <= local_414 && local_414 != *(float *)(in_RDI + 0xe0)) {
          local_68 = &local_198;
          local_6c = local_274;
          local_280 = (undefined4 *)
                      ((long)local_198 + (long)local_16c * (long)local_274 * local_188);
          local_294 = *local_280;
          local_290 = local_280[1];
          local_28c = local_280[2];
          local_288 = local_280[3];
          local_284 = local_23c;
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                     in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
          std::vector<float,_std::allocator<float>_>::push_back
                    (in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->xmin);
        }
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb70,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb68);
      iVar2 = *(int *)(in_RDI + 0xd8);
      sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_258);
      if (iVar2 < (int)sVar4) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffb80,
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb80,
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x13db717);
      nms_sorted_bboxes(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                        (float)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      for (local_2b8 = 0; uVar3 = local_2b8,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_2b0),
          uVar3 < sVar4; local_2b8 = local_2b8 + 1) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_2b0,local_2b8);
        local_2c0 = *pvVar5;
        in_stack_fffffffffffffbb8._M_current =
             (BBoxRect *)
             std::
             vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
             ::operator[](&local_220,(long)local_23c);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  (&local_258,local_2c0);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        in_stack_fffffffffffffbb0._M_current =
             (BBoxRect *)
             std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](&local_238,(long)local_23c);
        std::vector<float,_std::allocator<float>_>::operator[](&local_270,local_2c0);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->xmin);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb70)
      ;
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb70);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb70);
    }
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x13db8b5);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x13db8c2);
    for (local_2f4 = 1; local_2f4 < local_14c; local_2f4 = local_2f4 + 1) {
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::operator[](&local_220,(long)local_2f4);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](&local_238,(long)local_2f4);
      this_00 = &local_2d8;
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb58);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                (in_stack_fffffffffffffb60,
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffb58);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb58);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb58);
      in_stack_fffffffffffffba8 =
           std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
           insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                     ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)this_00,
                      in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                      in_stack_fffffffffffffba8._M_current);
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffb58);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffb60,
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffb58);
      std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffb58);
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffb58);
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                (this_00,(const_iterator)in_stack_fffffffffffffbb8._M_current,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 in_stack_fffffffffffffbb0._M_current,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 in_stack_fffffffffffffba8._M_current);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffb70,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb68);
    iVar2 = *(int *)(in_RDI + 0xdc);
    sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_2d8);
    if (iVar2 < (int)sVar4) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb80,
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb80,
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_2d8);
    if ((int)sVar4 == 0) {
      local_104 = 0;
    }
    else {
      pvVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_120,0);
      Mat::create(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78,
                  (size_t)in_stack_fffffffffffffb70,(Allocator *)in_stack_fffffffffffffb68);
      bVar9 = true;
      if (pvVar6->data != (void *)0x0) {
        bVar9 = pvVar6->cstep * (long)pvVar6->c == 0;
        local_38 = pvVar6;
      }
      local_f8 = pvVar6;
      if (bVar9) {
        local_104 = -100;
      }
      else {
        for (local_36c = 0; local_36c < (int)sVar4; local_36c = local_36c + 1) {
          pvVar7 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                             ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_2d8,
                              (long)local_36c);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_2f0,(long)local_36c);
          vVar1 = *pvVar8;
          local_7c = local_36c;
          in_stack_fffffffffffffb70 =
               (vector<float,_std::allocator<float>_> *)
               ((long)pvVar6->data + (long)pvVar6->w * (long)local_36c * pvVar6->elemsize);
          *(float *)&(in_stack_fffffffffffffb70->super__Vector_base<float,_std::allocator<float>_>).
                     _M_impl.super__Vector_impl_data._M_start = (float)pvVar7->label;
          *(value_type *)
           ((long)&(in_stack_fffffffffffffb70->super__Vector_base<float,_std::allocator<float>_>).
                   _M_impl.super__Vector_impl_data._M_start + 4) = vVar1;
          *(float *)&(in_stack_fffffffffffffb70->super__Vector_base<float,_std::allocator<float>_>).
                     _M_impl.super__Vector_impl_data._M_finish = pvVar7->xmin;
          *(float *)((long)&(in_stack_fffffffffffffb70->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish + 4) = pvVar7->ymin;
          *(float *)&(in_stack_fffffffffffffb70->super__Vector_base<float,_std::allocator<float>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage = pvVar7->xmax;
          *(float *)((long)&(in_stack_fffffffffffffb70->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4) = pvVar7->ymax;
          local_78 = pvVar6;
        }
        local_104 = 0;
      }
    }
    local_1a8 = 1;
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb70);
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffb70)
    ;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffb70);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffb70);
  }
  else {
    local_104 = -100;
    local_1a8 = 1;
  }
  ppvVar10 = &local_198;
  if (local_190 != (int *)0x0) {
    local_1c = 0xffffffff;
    LOCK();
    local_20 = *local_190;
    *local_190 = *local_190 + -1;
    UNLOCK();
    if (local_20 == 1) {
      local_50 = ppvVar10;
      local_18 = ppvVar10;
      if (local_178 == (long *)0x0) {
        local_10 = local_198;
        if (local_198 != (void *)0x0) {
          free(local_198);
        }
      }
      else {
        (**(code **)(*local_178 + 0x18))(local_178,local_198);
      }
    }
  }
  *ppvVar10 = (void *)0x0;
  ppvVar10[2] = (void *)0x0;
  *(undefined4 *)(ppvVar10 + 3) = 0;
  *(undefined4 *)(ppvVar10 + 5) = 0;
  *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
  *(undefined4 *)(ppvVar10 + 6) = 0;
  *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
  *(undefined4 *)(ppvVar10 + 7) = 0;
  ppvVar10[8] = (void *)0x0;
  ppvVar10[1] = (void *)0x0;
  return local_104;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        // if score of background class is larger than confidence threshold
        float score = mxnet_ssd_style ? confidence[i] : confidence[static_cast<size_t>(i) * static_cast<size_t>(num_class_copy)];
        if (score >= (1.0 - confidence_threshold))
        {
            continue;
        }
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = expf(var[2] * loc[2]) * pb_w;
        float bbox_h = expf(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector<std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector<std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = {bbox[0], bbox[1], bbox[2], bbox[3], i};
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}